

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.cpp
# Opt level: O2

bool __thiscall storage::BTInnerNode::search_node(BTInnerNode *this,int key,BTNode **out_record)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar4 = 0;
  iVar3 = (this->super_BTNode).used_links_count_ + -1;
  do {
    iVar2 = iVar3;
    if (iVar2 - iVar4 == 0 || iVar2 < iVar4) {
LAB_00103bde:
      *out_record = this->links_[iVar4];
      return true;
    }
    iVar3 = (iVar2 - iVar4 >> 1) + iVar4;
    iVar1 = (this->super_BTNode).keys_[iVar3];
    if (iVar1 == key) {
      iVar4 = iVar3 + 1;
      goto LAB_00103bde;
    }
    if (iVar1 <= key) {
      iVar4 = iVar3 + 1;
      iVar3 = iVar2;
    }
  } while( true );
}

Assistant:

bool BTInnerNode::search_node(int key, BTNode *&out_record) {
        int L = 0, R = used_links_count_ - 1;
        while (L < R) {
            int M = L + ((R - L) >> 1);   // avoid (L+R)/2 overflow
            if (keys_[M] == key) {
                out_record = links_[M + 1];
                return true;
            } else if (keys_[M] > key)
                R = M;
            else
                L = 1 + M;
        }
        out_record = links_[L];
        return true;
    }